

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O2

test_handler_class * __thiscall
ccel::handler_pool<test_handler_class>::construct<int>
          (handler_pool<test_handler_class> *this,int *__args)

{
  ulong uVar1;
  logic_error *this_00;
  element_type *peVar2;
  undefined8 *puVar3;
  
  if ((this->_pool_size != 0) && (this->_pool_size < this->_size_allocated + 0x38U)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Pool size limitation readched.");
LAB_00192eba:
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  uVar1 = this->_handler_limit;
  if (uVar1 != 0) {
    if (uVar1 == 0xffffffffffffffff) {
      if (this->_handler_count != 0xfffffffffffffffe) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"Pools handler limitation reached.");
        goto LAB_00192eba;
      }
    }
    else if (uVar1 < this->_handler_count + 1) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = clock_gettime;
      __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  peVar2 = boost::object_pool<test_handler_class,_boost::default_user_allocator_new_delete>::
           construct<int>(&this->
                           super_object_pool<test_handler_class,_boost::default_user_allocator_new_delete>
                          ,__args);
  this->_size_allocated = this->_size_allocated + 0x38;
  this->_handler_count = this->_handler_count + 1;
  return peVar2;
}

Assistant:

_T_Handler *
  construct(Args &&... __args) { // The exception handling wrapper of
                                 // object_pool's construct func;
    if (_pool_size)              // there is a limitation of pool size (!=0)
      if (_size_allocated + sizeof(__handler_type) > _pool_size)
        throw std::logic_error("Pool size limitation readched.");
    // no limitation of pool size, need to avoid run out of memory
    if (_handler_limit) { // there is limitaions of handler numbers
      if (_handler_limit == std::numeric_limits<std::size_t>::max()) {
        // Ok,the limitation is the max of size_t
        if (_handler_count + 1 < _handler_limit) // reached the maxium
          throw std::logic_error("Pools handler limitation reached.");
      } else if (_handler_count + 1 > _handler_limit) // reaced maxium
        throw std::bad_alloc();
    }
    try {
      auto __tmp_ptr_holder = __handler_type::construct(
          std::forward<Args>(__args)...); // this may cause std::bad_alloc
      _size_allocated += sizeof(__handler_type);
      _handler_count++;
      return __tmp_ptr_holder;
    } catch (std::bad_alloc &e) { // oops,no memory
      return nullptr;             // no need to do handling
      // cuz there're no resource applied by this pool in the thrown
    } catch (...) {
      throw;
    } // rethrow other I-DONT-CARE exceptions
  }